

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_receive_pdu(rtr_socket *rtr_socket,void *pdu,size_t pdu_len,time_t timeout)

{
  long lVar1;
  _Bool _Var2;
  long in_FS_OFFSET;
  int local_ac;
  uint remaining_len;
  int error;
  time_t timeout_local;
  size_t pdu_len_local;
  void *pdu_local;
  rtr_socket *rtr_socket_local;
  undefined8 local_80;
  pdu_header header;
  char txt_1 [43];
  char txt [56];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pdu_len < 0xffff) {
    __assert_fail("pdu_len >= RTR_MAX_PDU_LEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x1cf,
                  "int rtr_receive_pdu(struct rtr_socket *, void *, const size_t, const time_t)");
  }
  if (rtr_socket->state == RTR_SHUTDOWN) {
    rtr_socket_local._4_4_ = -1;
    goto LAB_0010c3fd;
  }
  local_ac = tr_recv_all(rtr_socket->tr_socket,pdu,8,timeout);
  if (-1 < local_ac) {
    local_80 = *pdu;
    rtr_pdu_header_to_host_byte_order(&local_80);
    if (local_80._4_4_ < 8) {
      local_ac = 0;
    }
    else if (local_80._4_4_ < 0x10000) {
      if ((rtr_socket->has_received_pdus & 1U) == 0) {
        if (((local_80._1_1_ != '\n') && ((uint)(byte)local_80 < rtr_socket->version)) &&
           (_Var2 = rtr_version_supported((byte)local_80), _Var2)) {
          lrtr_dbg("RTR Socket: First received PDU is a version %u PDU, downgrading from version %u to %u"
                   ,local_80 & 0xff,(ulong)rtr_socket->version,local_80 & 0xff);
          rtr_socket->version = (uint)(byte)local_80;
        }
        rtr_socket->has_received_pdus = true;
      }
      if (((uint)(byte)local_80 == rtr_socket->version) || (local_80._1_1_ == '\n')) {
        if (local_80._4_4_ - 8 != 0) {
          if (rtr_socket->state == RTR_SHUTDOWN) {
            rtr_socket_local._4_4_ = -1;
            goto LAB_0010c3fd;
          }
          local_ac = tr_recv_all(rtr_socket->tr_socket,(void *)((long)pdu + 8),
                                 (ulong)(local_80._4_4_ - 8),0x3c);
          if (local_ac < 0) goto LAB_0010c1d4;
        }
        *(ulong *)pdu = local_80;
        _Var2 = rtr_pdu_check_size((pdu_header *)pdu);
        if (_Var2) {
          rtr_pdu_footer_to_host_byte_order(pdu);
          if (((local_80._1_1_ == '\x04') || (local_80._1_1_ == '\x06')) &&
             (*(char *)((long)pdu + 0xb) != '\0')) {
            lrtr_dbg("RTR Socket: Warning: Zero field of received Prefix PDU doesn\'t contain 0");
          }
          if (local_80._1_1_ == '\v') {
            if (*pdu != '\x02') {
              local_ac = 4;
              goto LAB_0010c1d4;
            }
            if (*(short *)((long)pdu + 2) != 0) {
              lrtr_dbg("RTR Socket: Warning: Zero field of received ASPA PDU doesn\'t contain 0");
            }
            if (*(char *)((long)pdu + 9) != '\x03') {
              lrtr_dbg("RTR Socket: Warning: AFI flags of received ASPA PDU not set to 0x03");
            }
          }
          if ((local_80._1_1_ == '\t') && (*(char *)((long)pdu + 3) != '\0')) {
            lrtr_dbg("RTR Socket: Warning: ROUTER_KEY_PDU zero field is != 0");
          }
          rtr_socket_local._4_4_ = 0;
          goto LAB_0010c3fd;
        }
        local_ac = 0;
      }
      else {
        local_ac = 8;
      }
    }
    else {
      local_ac = 0x20;
    }
  }
LAB_0010c1d4:
  if (local_ac == -1) {
    rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
    rtr_socket_local._4_4_ = -1;
  }
  else if (local_ac == -2) {
    lrtr_dbg("RTR Socket: receive timeout expired");
    rtr_socket_local._4_4_ = -2;
  }
  else if (local_ac == -3) {
    lrtr_dbg("RTR Socket: receive call interrupted");
    rtr_socket_local._4_4_ = -3;
  }
  else {
    if (local_ac == 0) {
      lrtr_dbg("RTR Socket: corrupt PDU received");
      memcpy(txt_1 + 0x28,"corrupt data received, length value in PDU is too small",0x38);
      rtr_send_error_pdu_from_network(rtr_socket,pdu,8,CORRUPT_DATA,txt_1 + 0x28,0x38);
    }
    else if (local_ac == 0x20) {
      lrtr_dbg("RTR Socket: PDU too big");
      snprintf((char *)&header,0x2b,"PDU too big, max. PDU size is: %lu bytes");
      lrtr_dbg("RTR Socket: %s",&header);
      rtr_send_error_pdu_from_network(rtr_socket,pdu,8,CORRUPT_DATA,(char *)&header,0x2b);
    }
    else if (local_ac == 5) {
      lrtr_dbg("RTR Socket: Unsupported PDU type (%u) received",local_80 >> 8 & 0xff);
      rtr_send_error_pdu_from_network(rtr_socket,pdu,8,UNSUPPORTED_PDU_TYPE,(char *)0x0,0);
    }
    else {
      if (local_ac == 4) {
        lrtr_dbg("RTR Socket: PDU with unsupported Protocol version (%u) received",local_80 & 0xff);
        rtr_send_error_pdu_from_network(rtr_socket,pdu,8,UNSUPPORTED_PROTOCOL_VER,(char *)0x0,0);
        rtr_socket_local._4_4_ = -1;
        goto LAB_0010c3fd;
      }
      if (local_ac == 8) {
        lrtr_dbg("RTR Socket: PDU with unexpected Protocol version (%u) received",local_80 & 0xff);
        rtr_send_error_pdu_from_network(rtr_socket,pdu,8,UNEXPECTED_PROTOCOL_VERSION,(char *)0x0,0);
        rtr_socket_local._4_4_ = -1;
        goto LAB_0010c3fd;
      }
    }
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    rtr_socket_local._4_4_ = -1;
  }
LAB_0010c3fd:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return rtr_socket_local._4_4_;
}

Assistant:

static int rtr_receive_pdu(struct rtr_socket *rtr_socket, void *pdu, const size_t pdu_len, const time_t timeout)
{
	int error = RTR_SUCCESS;

	assert(pdu_len >= RTR_MAX_PDU_LEN);

	if (rtr_socket->state == RTR_SHUTDOWN)
		return RTR_ERROR;
	// receive packet header
	error = tr_recv_all(rtr_socket->tr_socket, pdu, sizeof(struct pdu_header), timeout);
	if (error < 0)
		goto error;
	else
		error = RTR_SUCCESS;

	// header in hostbyte order, retain original received pdu, in case we need to detach it to an error pdu
	struct pdu_header header;

	memcpy(&header, pdu, sizeof(header));
	rtr_pdu_header_to_host_byte_order(&header);

	// if header->len is < packet_header = corrupt data received
	if (header.len < sizeof(header)) {
		error = CORRUPT_DATA;
		goto error;
	} else if (header.len > RTR_MAX_PDU_LEN) { // PDU too big, > than MAX_PDU_LEN Bytes
		error = PDU_TOO_BIG;
		goto error;
	}

	// Handle live downgrading
	if (!rtr_socket->has_received_pdus) {
		if (header.type != ERROR && rtr_socket->version > header.ver && rtr_version_supported(header.ver)) {
			RTR_DBG("First received PDU is a version %u PDU, downgrading from version %u to %u", header.ver,
				rtr_socket->version, header.ver);
			rtr_socket->version = header.ver;
		}
		rtr_socket->has_received_pdus = true;
	}

	// Handle wrong protocol version
	// If it is a error PDU, it will be handled by rtr_handle_error_pdu
	if (header.ver != rtr_socket->version && header.type != ERROR) {
		error = UNEXPECTED_PROTOCOL_VERSION;
		goto error;
	}

	// receive packet payload
	const unsigned int remaining_len = header.len - sizeof(header);

	if (remaining_len > 0) {
		if (rtr_socket->state == RTR_SHUTDOWN)
			return RTR_ERROR;
		error = tr_recv_all(rtr_socket->tr_socket, (((char *)pdu) + sizeof(header)), remaining_len,
				    RTR_RECV_TIMEOUT);
		if (error < 0)
			goto error;
		else
			error = RTR_SUCCESS;
	}
	// copy header in host_byte_order to pdu
	memcpy(pdu, &header, sizeof(header));

	// Check if the header len value is valid
	if (rtr_pdu_check_size(pdu) == false) {
		// TODO Restore byteorder for sending error PDU
		error = CORRUPT_DATA;
		goto error;
	}
	// At this point it is save to cast and use the PDU

	rtr_pdu_footer_to_host_byte_order(pdu);

	// Here we should handle error PDUs instead of doing it in
	// several other places...

	if (header.type == IPV4_PREFIX || header.type == IPV6_PREFIX) {
		if (((struct pdu_ipv4 *)pdu)->zero != 0)
			RTR_DBG1("Warning: Zero field of received Prefix PDU doesn't contain 0");
	}
	if (header.type == ASPA) {
		if (((struct pdu_aspa *)pdu)->ver != RTR_PROTOCOL_VERSION_2) {
			error = UNSUPPORTED_PROTOCOL_VER;
			goto error;
		}

		if (((struct pdu_aspa *)pdu)->zero != 0)
			RTR_DBG1("Warning: Zero field of received ASPA PDU doesn't contain 0");

		if (((struct pdu_aspa *)pdu)->afi_flags != 0b11)
			RTR_DBG1("Warning: AFI flags of received ASPA PDU not set to 0x03");
	}
	if (header.type == ROUTER_KEY && ((struct pdu_router_key *)pdu)->zero != 0)
		RTR_DBG1("Warning: ROUTER_KEY_PDU zero field is != 0");

	return RTR_SUCCESS;

error:
	// send error msg to server, including unmodified pdu header(pdu variable instead header)
	if (error == -1) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	} else if (error == TR_WOULDBLOCK) {
		RTR_DBG1("receive timeout expired");
		return TR_WOULDBLOCK;
	} else if (error == TR_INTR) {
		RTR_DBG1("receive call interrupted");
		return TR_INTR;
	} else if (error == CORRUPT_DATA) {
		RTR_DBG1("corrupt PDU received");
		const char txt[] = "corrupt data received, length value in PDU is too small";

		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), CORRUPT_DATA, txt, sizeof(txt));
	} else if (error == PDU_TOO_BIG) {
		RTR_DBG1("PDU too big");
		char txt[43];

		snprintf(txt, sizeof(txt), "PDU too big, max. PDU size is: %lu bytes", RTR_MAX_PDU_LEN);
		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), CORRUPT_DATA, txt, sizeof(txt));
	} else if (error == UNSUPPORTED_PDU_TYPE) {
		RTR_DBG("Unsupported PDU type (%u) received", header.type);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNSUPPORTED_PDU_TYPE, NULL, 0);
	} else if (error == UNSUPPORTED_PROTOCOL_VER) {
		RTR_DBG("PDU with unsupported Protocol version (%u) received", header.ver);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNSUPPORTED_PROTOCOL_VER, NULL, 0);
		return RTR_ERROR;
	} else if (error == UNEXPECTED_PROTOCOL_VERSION) {
		RTR_DBG("PDU with unexpected Protocol version (%u) received", header.ver);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNEXPECTED_PROTOCOL_VERSION, NULL, 0);
		return RTR_ERROR;
	}

	rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
	return RTR_ERROR;
}